

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fct_filter_pass(char *prefix,char *test_str)

{
  long lVar1;
  int iVar2;
  char cVar3;
  long lVar4;
  
  if (test_str == (char *)0x0) {
    __assert_fail("test_str != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x163
                  ,"int fct_filter_pass(const char *, const char *)");
  }
  iVar2 = 1;
  if ((prefix != (char *)0x0) && (cVar3 = *prefix, cVar3 != '\0')) {
    lVar4 = 0;
    iVar2 = 0;
    while (cVar3 != '\0') {
      if (cVar3 != test_str[lVar4]) {
        return 0;
      }
      lVar1 = lVar4 + 1;
      lVar4 = lVar4 + 1;
      iVar2 = 1;
      cVar3 = prefix[lVar1];
    }
  }
  return iVar2;
}

Assistant:

static nbool_t
fct_filter_pass(char const *prefix, char const *test_str)
{
    nbool_t is_match = FCT_FALSE;
    char const *prefix_p;
    char const *test_str_p;

    /* If you got nothing to test against, why test? */
    FCT_ASSERT( test_str != NULL );

    /* When the prefix is NULL or blank, we always return FCT_TRUE. */
    if ( prefix == NULL  || prefix[0] == '\0' )
    {
        return FCT_TRUE;
    }

    /* Iterate through both character arrays at the same time. We are
    going to play a game and see if we can beat the house. */
    for ( prefix_p = prefix, test_str_p = test_str;
            *prefix_p != '\0' && *test_str_p != '\0';
            ++prefix_p, ++test_str_p )
    {
        is_match = *prefix_p == *test_str_p;
        if ( !is_match )
        {
            break;   /* Quit the first time we don't match. */
        }
    }

    /* If the iterator for the test_str is pointing at the null char, and
    the iterator for the prefix string is not, then the prefix string is
    larger than the actual test string, and therefore we failed to pass the
    filter. */
    if ( *test_str_p == '\0' && *prefix_p != '\0' )
    {
        return FCT_FALSE;
    }

    /* is_match will be set to the either FCT_TRUE if we kicked of the loop
    early because our filter ran out of characters or FCT_FALSE if we
    encountered a mismatch before our filter ran out of characters. */
    return is_match;
}